

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void __thiscall
TCMallocImplementation::GetStats(TCMallocImplementation *this,char *buffer,int buffer_length)

{
  undefined1 local_18 [8];
  TCMalloc_Printer printer;
  
  *buffer = '\0';
  local_18 = (undefined1  [8])buffer;
  printer.buf_._0_4_ = buffer_length;
  DumpStats((TCMalloc_Printer *)local_18,(9999 < buffer_length) + 1);
  return;
}

Assistant:

virtual void GetStats(char* buffer, int buffer_length) {
    ASSERT(buffer_length > 0);
    TCMalloc_Printer printer(buffer, buffer_length);

    // Print level one stats unless lots of space is available
    if (buffer_length < 10000) {
      DumpStats(&printer, 1);
    } else {
      DumpStats(&printer, 2);
    }
  }